

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onemax.cpp
# Opt level: O0

float computeProbability(void)

{
  result_type_conflict rVar1;
  result_type_conflict1 rVar2;
  undefined1 local_2730 [8];
  mt19937 engine;
  uniform_real_distribution<float> local_1398;
  uniform_real_distribution<float> distribution;
  random_device rd;
  
  std::random_device::random_device((random_device *)&distribution);
  std::uniform_real_distribution<float>::uniform_real_distribution(&local_1398,0.0,100.0);
  rVar1 = std::random_device::operator()((random_device *)&distribution);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2730,(ulong)rVar1);
  rVar2 = std::uniform_real_distribution<float>::operator()
                    (&local_1398,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_2730);
  std::random_device::~random_device((random_device *)&distribution);
  return rVar2;
}

Assistant:

float computeProbability()
{
    std::random_device rd;
    std::uniform_real_distribution<float> distribution(0.0, 100.0);
    std::mt19937 engine(rd()); // Mersenne twister MT19937

    return distribution(engine);
}